

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O3

double __thiscall
TPZSparseBlockDiagonal<double>::GetVal(TPZSparseBlockDiagonal<double> *this,int64_t row,int64_t col)

{
  double dVar1;
  int64_t cblockindex;
  int64_t rblockindex;
  int64_t rblock;
  int64_t cblock;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  
  FindBlockIndex(this,row,&local_28,&local_30);
  dVar1 = 0.0;
  if (local_28 != -1) {
    FindBlockIndex(this,col,&local_20,&local_38);
    dVar1 = 0.0;
    if (local_20 == local_28) {
      dVar1 = (this->super_TPZBlockDiagonal<double>).fStorage.fStore
              [(this->super_TPZBlockDiagonal<double>).fBlockPos.fStore[local_20] +
               local_30 +
               (this->super_TPZBlockDiagonal<double>).fBlockSize.fStore[local_20] * local_38];
    }
  }
  return dVar1;
}

Assistant:

const TVar TPZSparseBlockDiagonal<TVar>::GetVal(const int64_t row, const int64_t col) const
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return (TVar) 0;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return (TVar) 0;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	return this->fStorage[this->fBlockPos[rblock]+pos];
}